

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APInt::multiplicativeInverse(APInt *this,APInt *modulo)

{
  uint numBits;
  void *pvVar1;
  bool bVar2;
  int iVar3;
  APInt *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar4;
  ulong uVar5;
  long lVar6;
  anon_union_8_2_1313ab2f_for_U *paVar7;
  ulong uVar8;
  ulong uVar9;
  anon_union_8_2_1313ab2f_for_U aVar10;
  APInt AVar11;
  APInt r [2];
  APInt q;
  APInt t [2];
  undefined8 uStack_c8;
  uint auStack_c0 [2];
  anon_union_8_2_1313ab2f_for_U local_b8;
  uint local_b0;
  anon_union_8_2_1313ab2f_for_U local_a8;
  uint local_a0;
  anon_union_8_2_1313ab2f_for_U local_90;
  APInt *local_88;
  APInt *local_80;
  anon_union_8_2_1313ab2f_for_U local_78;
  uint local_70 [2];
  anon_union_8_2_1313ab2f_for_U local_68;
  int aiStack_60 [2];
  anon_union_8_2_1313ab2f_for_U local_58 [3];
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  auStack_c0[0] = 0x17b897;
  auStack_c0[1] = 0;
  iVar3 = compare(modulo,in_RDX);
  if (-1 < iVar3) {
    auStack_c0[0] = 0x17bb13;
    auStack_c0[1] = 0;
    __assert_fail("ult(modulo) && \"This APInt must be smaller than the modulo\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x452,"APInt llvm::APInt::multiplicativeInverse(const APInt &) const");
  }
  local_b0 = in_RDX->BitWidth;
  if ((ulong)local_b0 < 0x41) {
    local_b8 = in_RDX->U;
  }
  else {
    uVar8 = (ulong)((uint)((ulong)local_b0 + 0x3f >> 3) & 0xfffffff8);
    auStack_c0[0] = 0x17b8cb;
    auStack_c0[1] = 0;
    local_b8.pVal = (uint64_t *)operator_new__(uVar8);
    auStack_c0[0] = 0x17b8dd;
    auStack_c0[1] = 0;
    memcpy(local_b8.pVal,(in_RDX->U).pVal,uVar8);
  }
  numBits = modulo->BitWidth;
  local_a0 = numBits;
  local_90 = (anon_union_8_2_1313ab2f_for_U)this;
  local_80 = in_RDX;
  if ((ulong)numBits < 0x41) {
    local_a8 = modulo->U;
  }
  else {
    uVar8 = (ulong)((uint)((ulong)numBits + 0x3f >> 3) & 0xfffffff8);
    auStack_c0[0] = 0x17b915;
    auStack_c0[1] = 0;
    local_a8.pVal = (uint64_t *)operator_new__(uVar8);
    auStack_c0[0] = 0x17b928;
    auStack_c0[1] = 0;
    memcpy(local_a8.pVal,(modulo->U).pVal,uVar8);
  }
  uVar8 = 0;
  auStack_c0[0] = 0x17b93c;
  auStack_c0[1] = 0;
  APInt((APInt *)&local_68,numBits,0,false);
  auStack_c0[0] = 0x17b956;
  auStack_c0[1] = 0;
  APInt((APInt *)local_58,modulo->BitWidth,1,false);
  auStack_c0[0] = 0x17b968;
  auStack_c0[1] = 0;
  APInt((APInt *)&local_78,modulo->BitWidth,0,false);
  paVar7 = &local_a8;
  auStack_c0[0] = 0x17b977;
  auStack_c0[1] = 0;
  bVar2 = operator==((APInt *)paVar7,0);
  if (!bVar2) {
    uVar5 = 1;
    uVar9 = uVar8;
    local_88 = modulo;
    do {
      uVar8 = uVar5;
      auStack_c0[0] = 0x17b9af;
      auStack_c0[1] = 0;
      udivrem((APInt *)(&local_b8 + uVar9 * 2),(APInt *)paVar7,(APInt *)&local_78,
              (APInt *)(&local_b8 + uVar9 * 2));
      auStack_c0[0] = 0x17b9c6;
      auStack_c0[1] = 0;
      operator*((APInt *)&local_40,(APInt *)(&local_68 + uVar8 * 2));
      auStack_c0[0] = 0x17b9d6;
      auStack_c0[1] = 0;
      operator-=((APInt *)(&local_68 + uVar9 * 2),(APInt *)&local_40);
      if ((0x40 < local_38) && ((void *)local_40.VAL != (void *)0x0)) {
        auStack_c0[0] = 0x17b9ef;
        auStack_c0[1] = 0;
        operator_delete__(local_40.pVal);
      }
      uVar5 = (ulong)((uint)uVar8 ^ 1);
      paVar7 = &local_b8 + uVar5 * 2;
      auStack_c0[0] = 0x17ba0a;
      auStack_c0[1] = 0;
      bVar2 = operator==((APInt *)paVar7,0);
      uVar9 = uVar8;
      modulo = local_88;
    } while (!bVar2);
  }
  auStack_c0[0] = 0x17ba2a;
  auStack_c0[1] = 0;
  bVar2 = operator==((APInt *)(&local_b8 + uVar8 * 2),1);
  aVar10 = local_90;
  if (bVar2) {
    paVar7 = &local_68 + uVar8 * 2;
    auStack_c0[0] = 0x17ba44;
    auStack_c0[1] = 0;
    bVar2 = operator[]((APInt *)paVar7,aiStack_60[uVar8 * 4] - 1);
    uVar4 = extraout_RDX;
    if (bVar2) {
      auStack_c0[0] = 0x17ba55;
      auStack_c0[1] = 0;
      operator+=((APInt *)paVar7,local_80);
      uVar4 = extraout_RDX_00;
    }
    *(int *)(local_90.VAL + 8) = aiStack_60[uVar8 * 4];
    *local_90.pVal = (uint64_t)*paVar7;
    aiStack_60[uVar8 * 4] = 0;
    aVar10 = local_90;
  }
  else {
    auStack_c0[0] = 0x17ba87;
    auStack_c0[1] = 0;
    APInt((APInt *)local_90.pVal,modulo->BitWidth,0,false);
    uVar4 = extraout_RDX_01;
  }
  if ((0x40 < local_70[0]) && ((void *)local_78.VAL != (void *)0x0)) {
    auStack_c0[0] = 0x17ba9d;
    auStack_c0[1] = 0;
    operator_delete__(local_78.pVal);
    uVar4 = extraout_RDX_02;
  }
  lVar6 = 0x20;
  do {
    if ((0x40 < *(uint *)((long)local_70 + lVar6)) &&
       (pvVar1 = *(void **)((long)local_70 + lVar6 + -8), pvVar1 != (void *)0x0)) {
      auStack_c0[0] = 0x17bab8;
      auStack_c0[1] = 0;
      operator_delete__(pvVar1);
      uVar4 = extraout_RDX_03;
    }
    lVar6 = lVar6 + -0x10;
  } while (lVar6 != 0);
  lVar6 = 0x20;
  do {
    if ((0x40 < *(uint *)((long)auStack_c0 + lVar6)) &&
       (*(void **)((long)&uStack_c8 + lVar6) != (void *)0x0)) {
      auStack_c0[0] = 0x17bad9;
      auStack_c0[1] = 0;
      operator_delete__(*(void **)((long)&uStack_c8 + lVar6));
      uVar4 = extraout_RDX_04;
    }
    lVar6 = lVar6 + -0x10;
  } while (lVar6 != 0);
  AVar11._8_8_ = uVar4;
  AVar11.U.VAL = aVar10.VAL;
  return AVar11;
}

Assistant:

APInt APInt::multiplicativeInverse(const APInt& modulo) const {
  assert(ult(modulo) && "This APInt must be smaller than the modulo");

  // Using the properties listed at the following web page (accessed 06/21/08):
  //   http://www.numbertheory.org/php/euclid.html
  // (especially the properties numbered 3, 4 and 9) it can be proved that
  // BitWidth bits suffice for all the computations in the algorithm implemented
  // below. More precisely, this number of bits suffice if the multiplicative
  // inverse exists, but may not suffice for the general extended Euclidean
  // algorithm.

  APInt r[2] = { modulo, *this };
  APInt t[2] = { APInt(BitWidth, 0), APInt(BitWidth, 1) };
  APInt q(BitWidth, 0);

  unsigned i;
  for (i = 0; r[i^1] != 0; i ^= 1) {
    // An overview of the math without the confusing bit-flipping:
    // q = r[i-2] / r[i-1]
    // r[i] = r[i-2] % r[i-1]
    // t[i] = t[i-2] - t[i-1] * q
    udivrem(r[i], r[i^1], q, r[i]);
    t[i] -= t[i^1] * q;
  }

  // If this APInt and the modulo are not coprime, there is no multiplicative
  // inverse, so return 0. We check this by looking at the next-to-last
  // remainder, which is the gcd(*this,modulo) as calculated by the Euclidean
  // algorithm.
  if (r[i] != 1)
    return APInt(BitWidth, 0);

  // The next-to-last t is the multiplicative inverse.  However, we are
  // interested in a positive inverse. Calculate a positive one from a negative
  // one if necessary. A simple addition of the modulo suffices because
  // abs(t[i]) is known to be less than *this/2 (see the link above).
  if (t[i].isNegative())
    t[i] += modulo;

  return std::move(t[i]);
}